

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManTransformDualOutput(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *p_00;
  Gia_Man_t *p_01;
  char *pcVar8;
  Gia_Obj_t *pGVar9;
  Gia_Obj_t *pObj;
  Gia_Man_t *pGVar10;
  int iVar11;
  Vec_Int_t *p_02;
  
  pVVar7 = Gia_ManCollectOneSide(p,0);
  p_00 = Gia_ManCollectOneSide(p,1);
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0xc05,"Gia_Man_t *Gia_ManTransformDualOutput(Gia_Man_t *)");
  }
  if ((p->vCos->nSize & 1) != 0) {
    __assert_fail("(Gia_ManPoNum(p) & 1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0xc06,"Gia_Man_t *Gia_ManTransformDualOutput(Gia_Man_t *)");
  }
  iVar2 = pVVar7->nSize;
  iVar1 = p_00->nSize;
  p_02 = pVVar7;
  if (iVar1 < iVar2) {
    p_02 = p_00;
    p_00 = pVVar7;
  }
  if (p_00->nSize < p_02->nSize) {
    __assert_fail("Vec_IntSize(vNodes0) <= Vec_IntSize(vNodes1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0xc0c,"Gia_Man_t *Gia_ManTransformDualOutput(Gia_Man_t *)");
  }
  p_01 = Gia_ManStart(p->nObjs);
  pcVar8 = Abc_UtilStrsav(p->pName);
  p_01->pName = pcVar8;
  pcVar8 = Abc_UtilStrsav(p->pSpec);
  p_01->pSpec = pcVar8;
  p->pObjs->Value = 0;
  Gia_ManHashAlloc(p_01);
  iVar11 = 0;
  while ((iVar11 < p->vCis->nSize && (pGVar9 = Gia_ManCi(p,iVar11), pGVar9 != (Gia_Obj_t *)0x0))) {
    uVar3 = Gia_ManAppendCi(p_01);
    pGVar9->Value = uVar3;
    iVar11 = iVar11 + 1;
  }
  for (iVar11 = 0; iVar11 < p_02->nSize; iVar11 = iVar11 + 1) {
    iVar4 = Vec_IntEntry(p_02,iVar11);
    pGVar9 = Gia_ManObj(p,iVar4);
    if (pGVar9 == (Gia_Obj_t *)0x0) break;
    iVar4 = Gia_ObjFanin0Copy(pGVar9);
    iVar5 = Gia_ObjFanin1Copy(pGVar9);
    uVar3 = Gia_ManHashAnd(p_01,iVar4,iVar5);
    pGVar9->Value = uVar3;
  }
  for (iVar11 = 0; iVar11 < p_00->nSize; iVar11 = iVar11 + 1) {
    iVar4 = Vec_IntEntry(p_00,iVar11);
    pGVar9 = Gia_ManObj(p,iVar4);
    if (pGVar9 == (Gia_Obj_t *)0x0) break;
    iVar4 = Gia_ObjFanin0Copy(pGVar9);
    iVar5 = Gia_ObjFanin1Copy(pGVar9);
    uVar3 = Gia_ManHashAnd(p_01,iVar4,iVar5);
    pGVar9->Value = uVar3;
  }
  Vec_IntFree(p_02);
  Vec_IntFree(p_00);
  uVar3 = 0;
  while (((int)uVar3 < p->vCos->nSize - p->nRegs &&
         (pGVar9 = Gia_ManCo(p,uVar3), pGVar9 != (Gia_Obj_t *)0x0))) {
    pObj = Gia_ManPo(p,uVar3 ^ iVar1 < iVar2);
    iVar11 = Gia_ObjFanin0Copy(pObj);
    uVar6 = Gia_ManAppendCo(p_01,iVar11);
    pGVar9->Value = uVar6;
    uVar3 = uVar3 + 1;
  }
  Gia_ManHashStop(p_01);
  Gia_ManSetRegNum(p_01,p->nRegs);
  pGVar10 = Gia_ManCleanup(p_01);
  Gia_ManStop(p_01);
  return pGVar10;
}

Assistant:

Gia_Man_t * Gia_ManTransformDualOutput( Gia_Man_t * p )
{
    Vec_Int_t * vNodes0 = Gia_ManCollectOneSide( p, 0 );
    Vec_Int_t * vNodes1 = Gia_ManCollectOneSide( p, 1 );
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObj2;
    int i, fSwap = 0;
    assert( Gia_ManRegNum(p) == 0 );
    assert( (Gia_ManPoNum(p) & 1) == 0 );
    if ( Vec_IntSize(vNodes0) > Vec_IntSize(vNodes1) )
    {
        ABC_SWAP( Vec_Int_t *, vNodes0, vNodes1 );
        fSwap = 1;
    }
    assert( Vec_IntSize(vNodes0) <= Vec_IntSize(vNodes1) );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachObjVec( vNodes0, p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachObjVec( vNodes1, p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Vec_IntFree( vNodes0 );
    Vec_IntFree( vNodes1 );
    Gia_ManForEachPo( p, pObj, i )
    {
        pObj2 = Gia_ManPo( p, i^fSwap );
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj2) );
    }
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}